

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerProfiledStFld
          (Lowerer *this,JitProfilingInstr *stFldInstr,PropertyOperationFlags flags)

{
  LowererMD *this_00;
  OpCode OVar1;
  Instr *pIVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  byte bVar6;
  undefined4 *puVar7;
  RegOpnd *opndArg;
  Opnd *pOVar8;
  PropertySymOpnd *pPVar9;
  IntConstOpnd *opndArg_00;
  HelperCallOpnd *this_01;
  PropertyOperationFlags fnHelper;
  
  if (stFldInstr->profileId != 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1b4b,"(stFldInstr->profileId == Js::Constants::NoProfileId)",
                       "stFldInstr->profileId == Js::Constants::NoProfileId");
    if (!bVar4) goto LAB_005d1e01;
    *puVar7 = 0;
  }
  pIVar2 = (stFldInstr->super_Instr).m_prev;
  this_00 = &this->m_lowererMD;
  opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,&opndArg->super_Opnd);
  OVar1 = (stFldInstr->super_Instr).m_opcode;
  if ((OVar1 == StSuperFldStrict) || (OVar1 == StSuperFld)) {
    pOVar8 = IR::Instr::UnlinkSrc2(&stFldInstr->super_Instr);
    LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,pOVar8);
  }
  pOVar8 = IR::Instr::UnlinkSrc1(&stFldInstr->super_Instr);
  LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,pOVar8);
  pOVar8 = IR::Instr::UnlinkDst(&stFldInstr->super_Instr);
  OVar5 = IR::Opnd::GetKind(pOVar8);
  if (OVar5 == OpndKindSym) {
    OVar5 = IR::Opnd::GetKind(pOVar8);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005d1e01;
      *puVar7 = 0;
    }
    if (*(char *)((long)pOVar8[1]._vptr_Opnd + 0x14) != '\x02') goto LAB_005d1c1a;
  }
  else {
LAB_005d1c1a:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1b72,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as dst of field store");
    if (!bVar4) goto LAB_005d1e01;
    *puVar7 = 0;
  }
  pPVar9 = IR::Opnd::AsPropertySymOpnd(pOVar8);
  opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar9->m_inlineCacheIndex,this->m_func);
  LowererMD::LoadHelperArgument(this_00,&stFldInstr->super_Instr,&opndArg_00->super_Opnd);
  LoadPropertySymAsArgument(this,&stFldInstr->super_Instr,pOVar8);
  OVar1 = (stFldInstr->super_Instr).m_opcode;
  if (OVar1 < StSuperFld) {
    fnHelper = PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
               PropertyOperation_PreInitSpecialValue|PropertyOperation_Force;
    if ((OVar1 != InitFld) && (OVar1 != InitRootFld)) {
LAB_005d1cd1:
      if ((flags & PropertyOperation_Root) == PropertyOperation_None) {
        fnHelper = (flags & PropertyOperation_StrictMode) * 3 +
                   (PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
                    PropertyOperation_PreInitSpecialValue|PropertyOperation_Root);
      }
      else {
        fnHelper = flags & PropertyOperation_StrictMode |
                   (PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
                    PropertyOperation_PreInitSpecialValue|PropertyOperation_ThrowIfNotExtensible|
                   PropertyOperation_Root);
      }
    }
  }
  else if (OVar1 == StSuperFldStrict) {
    fnHelper = PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
               PropertyOperation_PreInitSpecialValue|PropertyOperation_ThrowIfNotExtensible;
  }
  else {
    if (OVar1 != StSuperFld) goto LAB_005d1cd1;
    fnHelper = PropertyOperation_AllowUndeclInConsoleScope|PropertyOperation_NonFixedValue|
               PropertyOperation_PreInitSpecialValue|PropertyOperation_StrictModeRoot;
  }
  this_01 = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  if ((stFldInstr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005d1e01;
    *puVar7 = 0;
  }
  func = (stFldInstr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_005d1e01:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  bVar6 = (this_01->super_Opnd).field_0xb;
  if ((bVar6 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
    bVar6 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar6 | 2;
  (stFldInstr->super_Instr).m_src1 = &this_01->super_Opnd;
  LowererMD::LowerCall(this_00,&stFldInstr->super_Instr,0);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerProfiledStFld(IR::JitProfilingInstr *stFldInstr, Js::PropertyOperationFlags flags)
{
    Assert(stFldInstr->profileId == Js::Constants::NoProfileId);

    IR::Instr *const instrPrev = stFldInstr->m_prev;

    /*
        void ProfilingHelpers::ProfiledInitFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer)

        void ProfilingHelpers::ProfiledStFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer)

        void ProfilingHelpers::ProfiledStSuperFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer,
            const Var thisInstance)
    {
    */

    m_lowererMD.LoadHelperArgument(stFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));

    if (stFldInstr->m_opcode == Js::OpCode::StSuperFld || stFldInstr->m_opcode == Js::OpCode::StSuperFldStrict)
    {
        m_lowererMD.LoadHelperArgument(stFldInstr, stFldInstr->UnlinkSrc2());
    }

    m_lowererMD.LoadHelperArgument(stFldInstr, stFldInstr->UnlinkSrc1());

    IR::Opnd *dst = stFldInstr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as dst of field store");
    m_lowererMD.LoadHelperArgument(
        stFldInstr,
        IR::Opnd::CreateInlineCacheIndexOpnd(dst->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

    LoadPropertySymAsArgument(stFldInstr, dst);

    IR::JnHelperMethod helper;
    switch (stFldInstr->m_opcode)
    {
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
        helper = IR::HelperProfiledInitFld;
        break;

    case Js::OpCode::StSuperFld:
        helper = IR::HelperProfiledStSuperFld;
        break;

    case Js::OpCode::StSuperFldStrict:
        helper = IR::HelperProfiledStSuperFld_Strict;
        break;

    default:
        helper =
            flags & Js::PropertyOperation_Root
                ? flags & Js::PropertyOperation_StrictMode ? IR::HelperProfiledStRootFld_Strict : IR::HelperProfiledStRootFld
                : flags & Js::PropertyOperation_StrictMode ? IR::HelperProfiledStFld_Strict : IR::HelperProfiledStFld;
        break;
    }
    stFldInstr->SetSrc1(IR::HelperCallOpnd::New(helper, m_func));
    m_lowererMD.LowerCall(stFldInstr, 0);

    return instrPrev;
}